

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O0

bool __thiscall Clasp::SatBuilder::addClause(SatBuilder *this,LitVec *clause,wsum_t cw)

{
  uintp uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  Solver *s;
  iterator pos;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *this_00;
  reference this_01;
  uintp in_RDX;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RSI;
  ProgramBuilder *in_RDI;
  Result RVar5;
  Literal *in_stack_ffffffffffffff38;
  SharedContext *in_stack_ffffffffffffff40;
  Literal *in_stack_ffffffffffffff48;
  ParserPtr *x;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_ffffffffffffff50;
  ParserPtr *first;
  SatBuilder *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  uint32 flags;
  LitVec *in_stack_ffffffffffffff68;
  bool local_69;
  LitVec *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ConstraintInfo local_34;
  Result local_30;
  uintp local_20;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *local_18;
  bool local_1;
  
  flags = (uint32)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  ProgramBuilder::ctx(in_RDI);
  bVar2 = SharedContext::ok(in_stack_ffffffffffffff40);
  if ((!bVar2) ||
     (bVar2 = satisfied((SatBuilder *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8), uVar1 = local_20, bVar2)) {
    ProgramBuilder::ctx(in_RDI);
    local_1 = SharedContext::ok(in_stack_ffffffffffffff40);
  }
  else {
    if (((long)local_20 < 0) ||
       ((iVar3 = std::numeric_limits<int>::max(), (long)iVar3 < (long)uVar1 &&
        (local_20 != in_RDI[2].parser_.ptr_)))) {
      Potassco::fail(-2,"bool Clasp::SatBuilder::addClause(LitVec &, wsum_t)",0x88,
                     "cw >= 0 && (cw <= std::numeric_limits<weight_t>::max() || cw == hardWeight_)",
                     "Clause weight out of bounds",0);
    }
    if (local_20 == in_RDI[2].parser_.ptr_) {
      ProgramBuilder::ctx(in_RDI);
      s = SharedContext::master((SharedContext *)0x1ca508);
      ConstraintInfo::ConstraintInfo(&local_34,Static);
      RVar5 = ClauseCreator::create
                        (s,in_stack_ffffffffffffff68,flags,
                         (ConstraintInfo *)in_stack_ffffffffffffff58);
      local_30.local = RVar5.local;
      local_30.status = RVar5.status;
      bVar2 = ClauseCreator::Result::ok(&local_30);
      local_69 = false;
      if (bVar2) {
        local_69 = markAssigned(in_stack_ffffffffffffff58);
      }
      local_1 = local_69;
    }
    else {
      Literal::fromRep(0x1ca5d0);
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      sVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(local_18);
      if (sVar4 < 2) {
        bVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::empty(local_18)
        ;
        if (bVar2) {
          lit_true();
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        }
        else {
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::back(local_18);
          Literal::operator~(in_stack_ffffffffffffff38);
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        }
      }
      else {
        x = &in_RDI[1].parser_;
        *(int *)&in_RDI[2].frozen_ = *(int *)&in_RDI[2].frozen_ + 1;
        posLit(0x1ca618);
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (in_stack_ffffffffffffff50,(Literal *)x);
        first = &in_RDI[1].parser_;
        pos = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
                        ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                         &in_RDI[1].parser_);
        this_00 = (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                            (local_18);
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end(local_18);
        bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::insert<Clasp::Literal*>
                  (this_00,pos,(Literal *)first,(Literal *)x,
                   (type_conflict *)in_stack_ffffffffffffff40);
      }
      this_01 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::back
                          ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                           &in_RDI[1].parser_);
      Literal::flag(this_01);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool SatBuilder::addClause(LitVec& clause, wsum_t cw) {
	if (!ctx()->ok() || satisfied(clause)) { return ctx()->ok(); }
	POTASSCO_REQUIRE(cw >= 0 && (cw <= std::numeric_limits<weight_t>::max() || cw == hardWeight_), "Clause weight out of bounds");
	if (cw == hardWeight_) {
		return ClauseCreator::create(*ctx()->master(), clause, Constraint_t::Static).ok() && markAssigned();
	}
	else {
		// Store weight, relaxation var, and (optionally) clause
		softClauses_.push_back(Literal::fromRep((uint32)cw));
		if      (clause.size() > 1){ softClauses_.push_back(posLit(++vars_)); softClauses_.insert(softClauses_.end(), clause.begin(), clause.end()); }
		else if (!clause.empty())  { softClauses_.push_back(~clause.back());  }
		else                       { softClauses_.push_back(lit_true()); }
		softClauses_.back().flag(); // mark end of clause
	}
	return true;
}